

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareOffsets_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  TestError *this_00;
  size_t start_position;
  size_t i;
  size_t position;
  allocator<char> local_32;
  undefined1 local_31;
  char *local_30;
  GLchar *type;
  _texture_target *target;
  testCase *test_case_local;
  SmokeTest *this_local;
  string *offsets;
  
  type = texture_targets + test_case->m_source_texture_target_index * 0x30;
  local_30 = (char *)0x0;
  local_31 = 0;
  target = (_texture_target *)test_case;
  test_case_local = (testCase *)this;
  this_local = (SmokeTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)",&local_32);
  std::allocator<char>::~allocator(&local_32);
  switch(*(undefined8 *)(type + 0x10)) {
  case 1:
    local_30 = "int";
    break;
  case 2:
    local_30 = "ivec2";
    break;
  case 3:
    local_30 = "ivec3";
    break;
  case 4:
    local_30 = "ivec4";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0xd32);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  i = 0;
  Utils::replaceToken("TYPE",&i,local_30,__return_storage_ptr__);
  for (start_position = 0; sVar1 = i, start_position < *(ulong *)(type + 8);
      start_position = start_position + 1) {
    Utils::replaceToken("VAL_LIST",&i,"0, VAL_LIST",__return_storage_ptr__);
    i = sVar1 + 1;
  }
  Utils::replaceToken(", VAL_LIST",&i,"",__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareOffsets(const testCase& test_case)
{
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = DE_NULL;

	std::string offsets = "TYPE(VAL_LIST)";

	switch (target.m_n_derivatives)
	{
	case 1:
		type = "int";
		break;
	case 2:
		type = "ivec2";
		break;
	case 3:
		type = "ivec3";
		break;
	case 4:
		type = "ivec4";
		break;
	default:
		TCU_FAIL("Invalid value");
		break;
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, offsets);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", offsets);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", offsets);

	return offsets;
}